

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

shared_ptr<cppnet::Alloter> cppnet::MakePoolAlloterPtr(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::Alloter> *in_RDI;
  shared_ptr<cppnet::Alloter> sVar1;
  shared_ptr<cppnet::PoolAlloter> local_20;
  
  std::make_shared<cppnet::PoolAlloter>();
  std::shared_ptr<cppnet::Alloter>::shared_ptr<cppnet::PoolAlloter,void>(in_RDI,&local_20);
  std::shared_ptr<cppnet::PoolAlloter>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<cppnet::Alloter>)
         sVar1.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Alloter> MakePoolAlloterPtr() {
    return std::make_shared<cppnet::PoolAlloter>();
}